

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O2

size_t bssl::anon_unknown_0::GetClientHelloLen
                 (uint16_t max_version,uint16_t session_version,size_t ticket_len)

{
  _Head_base<0UL,_ssl_session_st_*,_false> s;
  bool bVar1;
  int iVar2;
  SSL_METHOD *pSVar3;
  time_t t;
  size_t sVar4;
  UniquePtr<SSL_SESSION> session;
  UniquePtr<SSL_CTX> ctx;
  UniquePtr<SSL_CTX> ssl_ctx;
  UniquePtr<SSL> ssl;
  vector<unsigned_char,_std::allocator<unsigned_char>_> client_hello;
  _Head_base<0UL,_ssl_session_st_*,_false> local_78;
  allocator_type local_69;
  _Head_base<0UL,_ssl_session_st_*,_false> local_68;
  __uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter> local_60;
  unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> local_58;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  pSVar3 = (SSL_METHOD *)TLS_method();
  local_60._M_t.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl =
       (tuple<ssl_ctx_st_*,_bssl::internal::Deleter>)SSL_CTX_new(pSVar3);
  local_38._M_impl.super__Vector_impl_data._M_start = (uint8_t *)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = DecodeBase64((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_38,
                       (anonymous_namespace)::kOpenSSLSession);
  if (bVar1) {
    pSVar3 = (SSL_METHOD *)TLS_method();
    local_58._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<ssl_ctx_st,_bssl::internal::Deleter,_true,_true>)SSL_CTX_new(pSVar3);
    if ((tuple<ssl_ctx_st_*,_bssl::internal::Deleter>)
        local_58._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl ==
        (_Head_base<0UL,_ssl_ctx_st_*,_false>)0x0) {
      local_68._M_head_impl = (ssl_session_st *)0x0;
      bVar1 = false;
    }
    else {
      local_78._M_head_impl._0_1_ = 0x61;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_50,ticket_len,
                 (value_type_conflict3 *)&local_78,&local_69);
      local_78._M_head_impl =
           SSL_SESSION_from_bytes
                     (local_38._M_impl.super__Vector_impl_data._M_start,
                      (long)local_38._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_38._M_impl.super__Vector_impl_data._M_start,
                      (SSL_CTX *)
                      local_58._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
      if ((((SSL_SESSION *)local_78._M_head_impl == (SSL_SESSION *)0x0) ||
          (iVar2 = SSL_SESSION_set_protocol_version(local_78._M_head_impl,session_version),
          iVar2 == 0)) ||
         (iVar2 = SSL_SESSION_set_ticket
                            (local_78._M_head_impl,local_50._M_impl.super__Vector_impl_data._M_start
                             ,(long)local_50._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_50._M_impl.super__Vector_impl_data._M_start),
         s._M_head_impl = local_78._M_head_impl, iVar2 == 0)) {
        local_68._M_head_impl = (ssl_session_st *)0x0;
        bVar1 = false;
      }
      else {
        t = time((time_t *)0x0);
        SSL_SESSION_set_time((SSL_SESSION *)s._M_head_impl,t);
        local_68._M_head_impl = local_78._M_head_impl;
        local_78._M_head_impl = (ssl_session_st *)0x0;
        bVar1 = (SSL_SESSION *)local_68._M_head_impl != (SSL_SESSION *)0x0;
      }
      std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&local_78);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_50);
    }
    std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&local_58);
  }
  else {
    local_68._M_head_impl = (ssl_session_st *)0x0;
    bVar1 = false;
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_38);
  sVar4 = 0;
  if ((local_60._M_t.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl !=
       (_Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>)0x0) && (bVar1)) {
    local_50._M_impl.super__Vector_impl_data._M_start =
         (pointer)SSL_new((SSL_CTX *)
                          local_60._M_t.
                          super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
    if ((((SSL *)local_50._M_impl.super__Vector_impl_data._M_start == (SSL *)0x0) ||
        ((iVar2 = SSL_set_session((SSL *)local_50._M_impl.super__Vector_impl_data._M_start,
                                  (SSL_SESSION *)local_68._M_head_impl), iVar2 == 0 ||
         (iVar2 = SSL_set_strict_cipher_list
                            ((SSL *)local_50._M_impl.super__Vector_impl_data._M_start,
                             "ECDHE-RSA-AES128-GCM-SHA256"), iVar2 == 0)))) ||
       (iVar2 = SSL_set_max_proto_version
                          ((SSL *)local_50._M_impl.super__Vector_impl_data._M_start,max_version),
       iVar2 == 0)) {
      sVar4 = 0;
    }
    else {
      local_38._M_impl.super__Vector_impl_data._M_start = (uint8_t *)0x0;
      local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar1 = GetClientHello((SSL *)local_50._M_impl.super__Vector_impl_data._M_start,
                             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_38);
      if (bVar1) {
        sVar4 = 0;
        if (5 < (ulong)((long)local_38._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_38._M_impl.super__Vector_impl_data._M_start)) {
          sVar4 = ((long)local_38._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_38._M_impl.super__Vector_impl_data._M_start) - 5;
        }
      }
      else {
        sVar4 = 0;
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_38);
    }
    std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&local_50);
  }
  std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&local_68);
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&local_60);
  return sVar4;
}

Assistant:

static size_t GetClientHelloLen(uint16_t max_version, uint16_t session_version,
                                size_t ticket_len) {
  bssl::UniquePtr<SSL_CTX> ctx(SSL_CTX_new(TLS_method()));
  bssl::UniquePtr<SSL_SESSION> session =
      CreateSessionWithTicket(session_version, ticket_len);
  if (!ctx || !session) {
    return 0;
  }

  // Set a one-element cipher list so the baseline ClientHello is unpadded.
  bssl::UniquePtr<SSL> ssl(SSL_new(ctx.get()));
  if (!ssl || !SSL_set_session(ssl.get(), session.get()) ||
      !SSL_set_strict_cipher_list(ssl.get(), "ECDHE-RSA-AES128-GCM-SHA256") ||
      !SSL_set_max_proto_version(ssl.get(), max_version)) {
    return 0;
  }

  std::vector<uint8_t> client_hello;
  if (!GetClientHello(ssl.get(), &client_hello) ||
      client_hello.size() <= SSL3_RT_HEADER_LENGTH) {
    return 0;
  }

  return client_hello.size() - SSL3_RT_HEADER_LENGTH;
}